

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * luaG_findlocal(lua_State *L,CallInfo *ci,int n,StkId *pos)

{
  Proto *f;
  int iVar1;
  char *pcVar2;
  CallInfo *pCVar3;
  StkId pSVar4;
  
  pSVar4 = (ci->func).p;
  if ((ci->callstatus & 0x8000) == 0) {
    f = *(Proto **)((pSVar4->val).value_.f + 0x18);
    if (n < 0) {
      if (((f->flag & 1) == 0) || (iVar1 = (ci->u).l.nextraargs, n < -iVar1)) {
        return (char *)0x0;
      }
      pSVar4 = pSVar4 + ((ulong)(uint)~n - (long)iVar1);
      pcVar2 = "(vararg)";
      goto LAB_00109748;
    }
    iVar1 = currentpc(ci);
    pcVar2 = luaF_getlocalname(f,n,iVar1);
    if (pcVar2 == (char *)0x0) goto LAB_001096f2;
  }
  else {
LAB_001096f2:
    if (L->ci == ci) {
      pCVar3 = (CallInfo *)&L->top;
    }
    else {
      pCVar3 = ci->next;
    }
    if (n < 1) {
      return (char *)0x0;
    }
    if ((long)(pCVar3->func).p - (long)(pSVar4 + 1) >> 4 < (long)n) {
      return (char *)0x0;
    }
    pcVar2 = "(C temporary)";
    if ((ci->callstatus & 0x8000) == 0) {
      pcVar2 = "(temporary)";
    }
  }
  if (pos == (StkId *)0x0) {
    return pcVar2;
  }
  pSVar4 = pSVar4 + 1 + ((ulong)(uint)n - 1);
LAB_00109748:
  *pos = pSVar4;
  return pcVar2;
}

Assistant:

const char *luaG_findlocal (lua_State *L, CallInfo *ci, int n, StkId *pos) {
  StkId base = ci->func.p + 1;
  const char *name = NULL;
  if (isLua(ci)) {
    if (n < 0)  /* access to vararg values? */
      return findvararg(ci, n, pos);
    else
      name = luaF_getlocalname(ci_func(ci)->p, n, currentpc(ci));
  }
  if (name == NULL) {  /* no 'standard' name? */
    StkId limit = (ci == L->ci) ? L->top.p : ci->next->func.p;
    if (limit - base >= n && n > 0) {  /* is 'n' inside 'ci' stack? */
      /* generic name for any valid slot */
      name = isLua(ci) ? "(temporary)" : "(C temporary)";
    }
    else
      return NULL;  /* no name */
  }
  if (pos)
    *pos = base + (n - 1);
  return name;
}